

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O0

void walk_stack(StackWord *start68k)

{
  StackWord SVar1;
  ushort uVar2;
  bool bVar3;
  DLword DVar4;
  DLword DVar5;
  StackWord SVar6;
  LispPTR LVar7;
  LispPTR LVar8;
  StackWord *pSVar9;
  LispPTR *pLVar10;
  StackWord *pSVar11;
  StackWord local_80;
  uint local_7c;
  Bframe *bf;
  int mblink;
  Bframe *mtmp;
  Bframe *dummybf;
  fnhead *fnobj;
  FX *fx;
  undefined2 local_2e;
  undefined2 local_2c;
  DLword freesize;
  DLword setflg;
  DLword savestack2;
  DLword savestack1;
  DLword save_nextblock;
  DLword *top_ivar;
  StackWord *endstack68k;
  StackWord *scanptr68k;
  StackWord *start68k_local;
  
  bVar3 = false;
  DVar5 = MachineState.pvar[-5];
  DVar4 = StackOffsetFromNative(MachineState.csp);
  if ((DVar5 != DVar4) || (MachineState.csp[1] != 0xa000)) {
    if (MachineState.csp <= MachineState.pvar + -10) {
      warn("CURRENTFX >= CurrentStackPTR??\n");
      LVar7 = LAddrFromNative(MachineState.pvar + -10);
      LVar8 = LAddrFromNative(MachineState.csp);
      printf("CURRENTFX=0x%x,CurrentStackPTR=0x%x\n",(ulong)LVar7,(ulong)LVar8);
    }
    bVar3 = true;
    printf("set CURRENTFX->nextblock in debugger. But it will be reset after this check \n");
    freesize = MachineState.pvar[-5];
    local_2c = *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2);
    local_2e = *(undefined2 *)((ulong)(MachineState.csp + 3) ^ 2);
    DVar5 = StackOffsetFromNative(MachineState.csp + 2);
    MachineState.pvar[-5] = DVar5;
    *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2) = 0xa000;
    *(short *)((ulong)(MachineState.csp + 3) ^ 2) =
         (short)((ulong)((long)MachineState.endofstack - (long)(MachineState.csp + 2)) >> 1);
  }
  if (start68k == (StackWord *)0x0) {
    endstack68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->stackbase);
    printf("Stack base = 0x%tx.",(long)endstack68k - (long)Stackspace >> 1);
  }
  else {
    endstack68k = (StackWord *)((ulong)start68k & 0xfffffffffffffffe);
    printf("Starting at 0x%tx.",(long)endstack68k - (long)Stackspace >> 1);
  }
  pSVar9 = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->endofstack);
  printf("  End of stack = 0x%tx.\n\n",(long)pSVar9 - (long)Stackspace >> 1);
  if (*(ushort *)((ulong)pSVar9 ^ 2) >> 0xd != 7) {
    printf("?? endstack is not GUARD BLK\nendstack = %p, flags = %d\n\n",pSVar9,
           (ulong)(*(ushort *)((ulong)pSVar9 ^ 2) >> 0xd));
  }
  while (pSVar11 = endstack68k, endstack68k < pSVar9) {
    uVar2 = *(ushort *)((ulong)endstack68k ^ 2) >> 0xd;
    if (uVar2 == 5) {
      fx._6_2_ = *endstack68k;
      printf("%04tx:  Free block (len %d/0x%x)\n",(long)endstack68k - (long)Stackspace >> 1,
             (ulong)(ushort)fx._6_2_,(ulong)(ushort)fx._6_2_);
      if (fx._6_2_ == (StackWord)0x0) {
        fx._6_2_ = (StackWord)0x2;
      }
      endstack68k = endstack68k + (int)(uint)(ushort)fx._6_2_;
    }
    else if (uVar2 == 6) {
      printf("%04tx:  ",(long)endstack68k - (long)Stackspace >> 1);
      pLVar10 = NativeAligned4FromLAddr(*(LispPTR *)(endstack68k + 2));
      print(pLVar10[2] & 0xfffffff);
      printf("\talink: 0x%04x, clink: 0x%04x, next: 0x%04x\n",(ulong)(ushort)*endstack68k,
             (ulong)(ushort)endstack68k[8],(ulong)(ushort)endstack68k[5]);
      DVar5 = StackOffsetFromNative(endstack68k + -2);
      if ((*(uint *)endstack68k & 1) == 0) {
        LVar7 = LAddrFromNative(endstack68k + -2);
        local_7c = LVar7 & 0xffff;
      }
      else {
        local_7c = (uint)(ushort)endstack68k[9];
      }
      if (DVar5 != local_7c) {
        if ((*(uint *)endstack68k & 1) == 0) {
          LVar7 = LAddrFromNative(endstack68k + -2);
          local_80 = SUB42(LVar7,0);
        }
        else {
          local_80 = endstack68k[9];
        }
        pSVar11 = (StackWord *)NativeAligned4FromStackOffset((DLword)local_80);
        if ((((ushort)endstack68k[-1] >> 9 & 1) == 0) || (endstack68k[-2] != *pSVar11)) {
          printf("       [Bad residual]\n");
        }
      }
      endstack68k = (StackWord *)NativeAligned2FromStackOffset((DLword)endstack68k[5]);
    }
    else if (uVar2 == 7) {
      fx._6_2_ = *endstack68k;
      printf("%04tx:  Guard block (len %d/0x%x)\n",(long)endstack68k - (long)Stackspace >> 1,
             (ulong)(ushort)fx._6_2_,(ulong)(ushort)fx._6_2_);
      if (fx._6_2_ == (StackWord)0x0) {
        fx._6_2_ = (StackWord)0x2;
      }
      endstack68k = endstack68k + (int)(uint)(ushort)fx._6_2_;
    }
    else {
      for (; *(ushort *)((ulong)endstack68k ^ 2) >> 0xd != 4; endstack68k = endstack68k + 2) {
        if (*(ushort *)((ulong)endstack68k ^ 2) >> 0xd != 0) {
          printf("%04tx:  Bad BF IVAR 0x%x\n",(long)endstack68k - (long)Stackspace >> 1,
                 (ulong)*(ushort *)((ulong)endstack68k ^ 2));
        }
      }
      printf("%04tx:  BF  usecnt %d, resid %d, padding %d, ivar 0x%04x\n",
             (long)endstack68k - (long)Stackspace >> 1,(ulong)((ushort)endstack68k[1] & 0xff),
             (ulong)((ushort)endstack68k[1] >> 9 & 1),(ulong)((ushort)endstack68k[1] >> 8 & 1),
             (ulong)(ushort)*endstack68k);
      SVar1 = *endstack68k;
      SVar6 = (StackWord)StackOffsetFromNative(pSVar11);
      if (SVar1 != SVar6) {
        printf("       [but top_ivar = 0x%04tx]\n",(long)pSVar11 - (long)Stackspace >> 1);
      }
      endstack68k = endstack68k + 2;
    }
    if ((endstack68k != start68k) && (pSVar9 < endstack68k)) {
      warn("scanptr exceeded end stack");
      printf("scanptr68k=%p endstack68k=%p",endstack68k,pSVar9);
    }
  }
  printf("\nStack Check done\n");
  if (bVar3) {
    MachineState.pvar[-5] = freesize;
    *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2) = local_2c;
    *(undefined2 *)((ulong)(MachineState.csp + 3) ^ 2) = local_2e;
  }
  return;
}

Assistant:

void walk_stack(StackWord *start68k) {
  StackWord *scanptr68k;
  StackWord *endstack68k;
  DLword *top_ivar;
  DLword save_nextblock;
  DLword savestack1, savestack2;
  DLword setflg = NIL;
  DLword freesize;

  if ((CURRENTFX->nextblock != StackOffsetFromNative(CurrentStackPTR)) || (!FSBP(CurrentStackPTR))) {
    if ((DLword *)CURRENTFX >= CurrentStackPTR) {
      WARN("CURRENTFX >= CurrentStackPTR??\n",
           printf("CURRENTFX=0x%x,CurrentStackPTR=0x%x\n", LAddrFromNative(CURRENTFX),
                  LAddrFromNative(CurrentStackPTR)));
    }
    setflg = T;
    printf("set CURRENTFX->nextblock in debugger. But it will be reset after this check \n");
    save_nextblock = CURRENTFX->nextblock;
    savestack1 = GETWORD(CurrentStackPTR + 2);
    savestack2 = GETWORD(CurrentStackPTR + 3);
    CURRENTFX->nextblock = StackOffsetFromNative(CurrentStackPTR + 2);
    GETWORD(CurrentStackPTR + 2) = STK_FSB_WORD;
    GETWORD(CurrentStackPTR + 3) = (((UNSIGNED)EndSTKP - (UNSIGNED)(CurrentStackPTR + 2)) >> 1);
  }

  /* Start from where caller specifies, (as real address!); if addr=0 */
  /* start from stackbase. */

  if (start68k) {
    scanptr68k = (StackWord *)((unsigned long)start68k & -2);
    printf("Starting at 0x%tx.", (DLword *)scanptr68k - Stackspace);
  } else {
    scanptr68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->stackbase);
    printf("Stack base = 0x%tx.", (DLword *)scanptr68k - Stackspace);
  }

  endstack68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->endofstack);

  printf("  End of stack = 0x%tx.\n\n", (DLword *)endstack68k - Stackspace);

  if (STKWORD(endstack68k)->flags != STK_GUARD)
    printf("?? endstack is not GUARD BLK\nendstack = %p, flags = %d\n\n", (void *)endstack68k,
           STKWORD(endstack68k)->flags);

  while (scanptr68k < endstack68k) {
    switch ((unsigned)(STKWORD(scanptr68k)->flags)) {
      /* Free stack block */
      case STK_FSB:
        freesize = FSB_size(scanptr68k);
        printf("%04tx:  Free block (len %d/0x%x)\n", (DLword *)scanptr68k - Stackspace, freesize,
               freesize);

        if (freesize == 0) { freesize = 2; }

        scanptr68k = (StackWord *)((DLword *)scanptr68k + freesize);

        break;

      case STK_GUARD:
        freesize = FSB_size(scanptr68k);
        printf("%04tx:  Guard block (len %d/0x%x)\n", (DLword *)scanptr68k - Stackspace, freesize,
               freesize);
        if (freesize == 0) { freesize = 2; }
        scanptr68k = (StackWord *)((DLword *)scanptr68k + freesize);

        break;

      case STK_FX:
        CHECK_FX((FX *)scanptr68k);

        printf("%04tx:  ", (DLword *)scanptr68k - Stackspace);

        {
          FX *fx = (FX *)scanptr68k;
          struct fnhead *fnobj;
#ifdef BIGVM
          fnobj = (struct fnhead *)NativeAligned4FromLAddr(fx->fnheader);
#else
          fnobj =
              (struct fnhead *)NativeAligned4FromLAddr(((int)fx->hi2fnheader << 16) | fx->lofnheader);
#endif /* BIGVM */
          print(fnobj->framename);
          printf("\talink: 0x%04x, clink: 0x%04x, next: 0x%04x\n", fx->alink, fx->clink,
                 fx->nextblock);
        }

        {
          Bframe *dummybf, *mtmp;
          int mblink;

          /* Now make sure the FX is connected to */
          /* a Basic Frame.                       */

          dummybf = (Bframe *)DUMMYBF(scanptr68k);

          /* Check for connection via BLINK field: */
          if (StackOffsetFromNative(dummybf) != GETBLINK(scanptr68k)) {
            mblink = GETBLINK(scanptr68k);
            mtmp = (Bframe *)NativeAligned4FromStackOffset(mblink);
            if ((dummybf->residual == NIL) || (dummybf->ivar != mtmp->ivar))
              printf("       [Bad residual]\n");
          }
        }

        scanptr68k = (StackWord *)NativeAligned2FromStackOffset(((FX *)scanptr68k)->nextblock);
        break;

      default:
        top_ivar = (DLword *)scanptr68k;
        while (STKWORD(scanptr68k)->flags != STK_BF) {
          if (STKWORD(scanptr68k)->flags != STK_NOTFLG) {
            printf("%04tx:  Bad BF IVAR 0x%x\n", (DLword *)scanptr68k - Stackspace,
                   GETWORD((DLword *)scanptr68k));
          }
          scanptr68k = (StackWord *)((DLword *)scanptr68k + DLWORDSPER_CELL);
        } /* while end */
        /* CHECK_BF(scanptr68k); */
        {
          Bframe *bf = (Bframe *)scanptr68k;
          printf("%04tx:  BF  usecnt %d, resid %d, padding %d, ivar 0x%04x\n",
                 (DLword *)scanptr68k - Stackspace, bf->usecnt, bf->residual, bf->padding,
                 bf->ivar);

          if (((Bframe *)scanptr68k)->ivar != StackOffsetFromNative(top_ivar))
            printf("       [but top_ivar = 0x%04tx]\n", top_ivar - Stackspace);
        }
        scanptr68k = (StackWord *)((DLword *)scanptr68k + DLWORDSPER_CELL);
        break;

    } /*switch end */

    if (scanptr68k != start68k) {
      if (scanptr68k > endstack68k) {
        WARN("scanptr exceeded end stack",
             printf("scanptr68k=%p endstack68k=%p", (void *)scanptr68k, (void *)endstack68k));
      }
    }
  } /* while end */

#ifdef FSBCHECK
  if (bigFSBindex != 0) {
    int i;

    printf("\nBIG FSB(s):\n");

    for (i = 0; i < bigFSBindex; i++) {
      printf("Offset: 0x%x , Size: 0x%x\n", bigFSB[i].offset, bigFSB[i].size);
    }
  }
#endif
  printf("\nStack Check done\n");
  if (setflg) {
    CURRENTFX->nextblock = save_nextblock;
    GETWORD(CurrentStackPTR + 2) = savestack1;
    GETWORD(CurrentStackPTR + 3) = savestack2;
  }

}